

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O1

int Aig_ManPackAddPatternTry(Aig_ManPack_t *p,int iBit,Vec_Int_t *vLits)

{
  uint *puVar1;
  int *piVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  iVar7 = iBit >> 5;
  if (0 < (long)vLits->nSize) {
    bVar5 = (byte)iBit & 0x1f;
    lVar6 = 0;
    do {
      uVar8 = vLits->pArray[lVar6];
      if ((int)uVar8 < 0) goto LAB_00631df0;
      uVar12 = uVar8 >> 1;
      if ((p->vPiPats->nSize <= (int)uVar12) || (p->vPiCare->nSize <= (int)uVar12))
      goto LAB_00631dd1;
      if (((*(uint *)((long)p->vPiCare->pArray + (long)iVar7 * 4 + (ulong)uVar12 * 8) & 1 << bVar5)
           != 0) &&
         (((*(uint *)((long)p->vPiPats->pArray + (long)iVar7 * 4 + (ulong)uVar12 * 8) >> bVar5 ^
           uVar8) & 1) == 0)) {
        return 0;
      }
      lVar6 = lVar6 + 1;
    } while (vLits->nSize != lVar6);
  }
  if (0 < vLits->nSize) {
    piVar2 = vLits->pArray;
    bVar5 = (byte)iBit & 0x1f;
    uVar8 = 1 << bVar5;
    pVVar3 = p->vPiPats;
    lVar6 = (long)iVar7;
    lVar9 = 0;
    do {
      uVar12 = piVar2[lVar9];
      if ((int)uVar12 < 0) {
LAB_00631df0:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar10 = uVar12 >> 1;
      if ((pVVar3->nSize <= (int)uVar10) || (p->vPiCare->nSize <= (int)uVar10)) {
LAB_00631dd1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar11 = (ulong)uVar10 * 8;
      pwVar4 = pVVar3->pArray;
      puVar1 = (uint *)((long)p->vPiCare->pArray + lVar6 * 4 + lVar11);
      *puVar1 = *puVar1 | uVar8;
      uVar10 = *(uint *)((long)pwVar4 + lVar6 * 4 + lVar11);
      if (((uVar10 >> bVar5 ^ uVar12) & 1) == 0) {
        *(uint *)((long)pwVar4 + lVar6 * 4 + lVar11) = uVar10 ^ uVar8;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vLits->nSize);
  }
  return 1;
}

Assistant:

int Aig_ManPackAddPatternTry( Aig_ManPack_t * p, int iBit, Vec_Int_t * vLits )
{
    word * pInfo, * pPres;
    int i, Lit;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        if ( Abc_InfoHasBit( (unsigned *)pPres, iBit ) && 
             Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             return 0;
    }
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        Abc_InfoSetBit( (unsigned *)pPres, iBit );
        if ( Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             Abc_InfoXorBit( (unsigned *)pInfo, iBit );
    }
    return 1;
}